

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O3

void __thiscall
burst::
buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
::buffered_chunk_iterator
          (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
           *this,__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last,
          int chunk_size)

{
  char *__src;
  element_type *peVar1;
  size_t sVar2;
  long __n2;
  size_t __n;
  
  (this->m_current)._M_current = first._M_current;
  (this->m_end)._M_current = last._M_current;
  this->m_chunk_size = (long)chunk_size;
  peVar1 = (element_type *)operator_new__((long)chunk_size);
  (this->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char*,std::default_delete<char[]>,std::allocator<void>,void>
            (&(this->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             peVar1);
  __n = this->m_chunk_size;
  peVar1 = (this->m_chunk).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->m_chunk_end = peVar1;
  if (0 < (long)__n) {
    __src = (this->m_current)._M_current;
    sVar2 = (long)(this->m_end)._M_current - (long)__src;
    if ((long)sVar2 < (long)__n) {
      __n = sVar2;
    }
    if (0 < (long)sVar2) {
      memmove(peVar1,__src,__n);
      peVar1 = peVar1 + __n;
    }
    (this->m_current)._M_current = __src + __n;
    this->m_chunk_end = peVar1;
    return;
  }
  __assert_fail("m_chunk_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x4f,
                "burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>, int>::buffered_chunk_iterator(Iterator, Iterator, Integral) [Iterator = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, Integral = int]"
               );
}

Assistant:

buffered_chunk_iterator (Iterator first, Iterator last, Integral chunk_size):
            m_current(first),
            m_end(last),
            m_chunk_size(static_cast<difference_type>(chunk_size)),
            m_chunk
            (
                std::shared_ptr<buffer_value_type>
                (
                    new buffer_value_type[static_cast<std::size_t>(m_chunk_size)],
                    std::default_delete<buffer_value_type[]>{}
                )
            ),
            m_chunk_end(m_chunk.get())
        {
            assert(m_chunk_size > 0);
            increment();
        }